

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

Error __thiscall
llvm::DWARFUnit::extractRangeList
          (DWARFUnit *this,uint64_t RangeListOffset,DWARFDebugRangeList *RangeList)

{
  byte bVar1;
  DWARFSection *Section;
  bool bVar2;
  uint8_t AddressSize;
  DWARFObject *Obj;
  DWARFSection *in_RCX;
  uint64_t ActualRangeListOffset;
  DWARFDataExtractor RangesData;
  DWARFDebugRangeList *RangeList_local;
  uint64_t RangeListOffset_local;
  DWARFUnit *this_local;
  
  RangesData.Section = in_RCX;
  bVar2 = std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>::empty
                    ((vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                      *)(RangeListOffset + 0x1a8));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!DieArray.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFUnit.cpp"
                  ,0x14b,
                  "Error llvm::DWARFUnit::extractRangeList(uint64_t, DWARFDebugRangeList &) const");
  }
  Obj = DWARFContext::getDWARFObj(*(DWARFContext **)(RangeListOffset + 8));
  Section = *(DWARFSection **)(RangeListOffset + 0x70);
  bVar1 = *(byte *)(RangeListOffset + 0xbc);
  AddressSize = getAddressByteSize((DWARFUnit *)RangeListOffset);
  DWARFDataExtractor::DWARFDataExtractor
            ((DWARFDataExtractor *)&ActualRangeListOffset,Obj,Section,(bool)(bVar1 & 1),AddressSize)
  ;
  DWARFDebugRangeList::extract
            ((DWARFDebugRangeList *)this,(DWARFDataExtractor *)RangesData.Section,
             &ActualRangeListOffset);
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error DWARFUnit::extractRangeList(uint64_t RangeListOffset,
                                  DWARFDebugRangeList &RangeList) const {
  // Require that compile unit is extracted.
  assert(!DieArray.empty());
  DWARFDataExtractor RangesData(Context.getDWARFObj(), *RangeSection,
                                isLittleEndian, getAddressByteSize());
  uint64_t ActualRangeListOffset = RangeSectionBase + RangeListOffset;
  return RangeList.extract(RangesData, &ActualRangeListOffset);
}